

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::
write_significand<fmt::v11::basic_appender<char>,char,char_const*,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,char *significand,int significand_size,int integral_size,
          char decimal_point,digit_grouping<char> *grouping)

{
  bool bVar1;
  make_unsigned_t<int> mVar2;
  char *pcVar3;
  char *end;
  basic_string_view<char> local_298;
  basic_appender<char> local_288;
  buffer<char> *local_280;
  basic_appender<char> local_268;
  allocator<char> local_259;
  undefined1 local_258 [8];
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> buffer;
  digit_grouping<char> *grouping_local;
  char decimal_point_local;
  int integral_size_local;
  int significand_size_local;
  char *significand_local;
  basic_appender<char> out_local;
  
  bVar1 = digit_grouping<char>::has_separator(grouping);
  if (bVar1) {
    basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *)local_258,
               &local_259);
    basic_appender<char>::basic_appender(&local_268,(buffer<char> *)local_258);
    local_280 = (buffer<char> *)
                write_significand<fmt::v11::basic_appender<char>,char>
                          (local_268,significand,significand_size,integral_size,decimal_point);
    local_288.container = out.container;
    pcVar3 = buffer<char>::data((buffer<char> *)local_258);
    mVar2 = to_unsigned<int>(integral_size);
    basic_string_view<char>::basic_string_view(&local_298,pcVar3,(ulong)mVar2);
    digit_grouping<char>::apply<fmt::v11::basic_appender<char>,char>(grouping,local_288,local_298);
    pcVar3 = buffer<char>::data((buffer<char> *)local_258);
    end = buffer<char>::end((buffer<char> *)local_258);
    out_local = copy_noinline<char,char*,fmt::v11::basic_appender<char>>
                          (pcVar3 + integral_size,end,out);
    basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::~basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *)local_258);
  }
  else {
    buffer._528_8_ = out.container;
    out_local = write_significand<fmt::v11::basic_appender<char>,char>
                          (out,significand,significand_size,integral_size,decimal_point);
  }
  return (basic_appender<char>)out_local.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.has_separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(basic_appender<Char>(buffer), significand, significand_size,
                    integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_noinline<Char>(buffer.data() + integral_size,
                                     buffer.end(), out);
}